

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void __thiscall CTcCodeStream::CTcCodeStream(CTcCodeStream *this,char stream_id)

{
  CTcDataStream::CTcDataStream(&this->super_CTcDataStream,stream_id);
  (this->super_CTcDataStream)._vptr_CTcDataStream = (_func_int **)&PTR__CTcCodeStream_00315910;
  (this->super_CTcDataStream).ofs_ = 0;
  this->active_lbl_ = (CTcCodeLabel *)0x0;
  this->free_lbl_ = (CTcCodeLabel *)0x0;
  this->free_fixup_ = (CTcLabelFixup *)0x0;
  this->symtab_ = (CTcPrsSymtab *)0x0;
  this->goto_symtab_ = (CTcPrsSymtab *)0x0;
  this->cur_switch_ = (CTPNStmSwitch *)0x0;
  this->enclosing_ = (CTPNStmEnclosing *)0x0;
  this->code_body_ = (CTPNCodeBody *)0x0;
  this->line_pages_ = (tcgen_line_page_t **)0x0;
  this->line_pages_alloc_ = 0;
  alloc_line_pages(this,5);
  this->line_cnt_ = 0;
  this->cur_frame_ = (CTcPrsSymtab *)0x0;
  return;
}

Assistant:

CTcCodeStream::CTcCodeStream(char stream_id)
    : CTcDataStream(stream_id)
{
    /* no switch yet */
    cur_switch_ = 0;

    /* no enclosing statement yet */
    enclosing_ = 0;

    /* no code body being generated yet */
    code_body_ = 0;

    /* start writing at offset zero */
    ofs_ = 0;

    /* no symbol tables yet */
    symtab_ = 0;
    goto_symtab_ = 0;

    /* no labels yet */
    active_lbl_ = 0;
    free_lbl_ = 0;

    /* no fixups yet */
    free_fixup_ = 0;

    /* allocate an initial set of line record pages */
    line_pages_alloc_ = 0;
    line_pages_ = 0;
    alloc_line_pages(5);

    /* no line records in use yet */
    line_cnt_ = 0;

    /* no local frame yet */
    cur_frame_ = 0;
}